

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O0

void __thiscall FC_BPNN::FC_BPNN(FC_BPNN *this,int perceptronNum,...)

{
  allocator<double> *this_00;
  char in_AL;
  size_type sVar1;
  ulong uVar2;
  reference pvVar3;
  mapped_type pPVar4;
  mapped_type *ppPVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int *local_210;
  int local_1a8 [4];
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined4 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  mapped_type local_f8;
  Preceptron *ptr;
  size_t finder;
  size_t finder1;
  size_t finder0;
  int k;
  int j;
  map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
  subNet;
  int i;
  undefined1 local_90 [8];
  vector<double,_std::allocator<double>_> layer_loss;
  allocator<double> local_61;
  value_type local_60;
  undefined1 local_58 [8];
  vector<double,_std::allocator<double>_> layer_value;
  uint local_38;
  int num;
  va_list ap;
  int perceptronNum_local;
  FC_BPNN *this_local;
  
  if (in_AL != '\0') {
    local_178 = in_XMM0_Da;
    local_168 = in_XMM1_Qa;
    local_158 = in_XMM2_Qa;
    local_148 = in_XMM3_Qa;
    local_138 = in_XMM4_Qa;
    local_128 = in_XMM5_Qa;
    local_118 = in_XMM6_Qa;
    local_108 = in_XMM7_Qa;
  }
  local_198 = in_RDX;
  local_190 = in_RCX;
  local_188 = in_R8;
  local_180 = in_R9;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->layers_value);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->layers_error);
  std::
  vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
  ::vector(&this->net);
  ap[0]._0_8_ = &stack0x00000008;
  local_38 = 0x18;
  layer_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = (int)local_198;
  while (-1 < layer_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_) {
    sVar1 = (size_type)
            layer_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    local_60 = 0.0;
    std::allocator<double>::allocator(&local_61);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_58,sVar1,&local_60,&local_61);
    std::allocator<double>::~allocator(&local_61);
    sVar1 = (size_type)
            layer_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    _i = 0.0;
    this_00 = (allocator<double> *)
              ((long)&subNet._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
    std::allocator<double>::allocator(this_00);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_90,sVar1,(value_type *)&i,this_00);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&subNet._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&this->layers_value,(value_type *)local_58);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&this->layers_error,(value_type *)local_90);
    if (local_38 < 0x29) {
      local_210 = (int *)((long)local_1a8 + (long)(int)local_38);
      local_38 = local_38 + 8;
    }
    else {
      local_210 = (int *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    layer_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = *local_210;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_90);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_58);
  }
  for (subNet._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
      uVar2 = (ulong)(int)subNet._M_t._M_impl.super__Rb_tree_header._M_node_count,
      sVar1 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&this->layers_value), uVar2 < sVar1;
      subNet._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (int)subNet._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    std::
    map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
    ::map((map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
           *)&k);
    finder0._4_4_ = 0;
    while( true ) {
      uVar2 = (ulong)finder0._4_4_;
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->layers_value,
                            (long)((int)subNet._M_t._M_impl.super__Rb_tree_header._M_node_count + -1
                                  ));
      sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
      if (sVar1 <= uVar2) break;
      finder0._0_4_ = 0;
      while( true ) {
        uVar2 = (ulong)(int)finder0;
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->layers_value,
                              (long)(int)subNet._M_t._M_impl.super__Rb_tree_header._M_node_count);
        sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
        if (sVar1 <= uVar2) break;
        finder1 = (size_t)finder0._4_4_;
        finder = (size_t)(int)finder0;
        ptr = (Preceptron *)(finder1 << 0x20 | finder);
        pPVar4 = (mapped_type)operator_new(0x98);
        (pPVar4->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pPVar4->output = 0.0;
        (pPVar4->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pPVar4->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pPVar4->learning_step = 0.0;
        *(undefined8 *)&pPVar4->useBias = 0;
        (pPVar4->delta_bias).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pPVar4->motivation = 0.0;
        (pPVar4->delta_bias).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pPVar4->delta_bias).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pPVar4->delta_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pPVar4->delta_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pPVar4->bias = 0.0;
        (pPVar4->delta_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pPVar4->weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pPVar4->weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ((Preceptron *)&pPVar4->_vptr_Preceptron)->_vptr_Preceptron = (_func_int **)0x0;
        (pPVar4->weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pPVar4->error = 0.0;
        Preceptron_SIGMOID::Preceptron_SIGMOID((Preceptron_SIGMOID *)pPVar4);
        local_f8 = pPVar4;
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->layers_value,
                              (long)((int)subNet._M_t._M_impl.super__Rb_tree_header._M_node_count +
                                    -1));
        sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
        (**((Preceptron *)&pPVar4->_vptr_Preceptron)->_vptr_Preceptron)(pPVar4,sVar1 & 0xffffffff);
        pPVar4 = local_f8;
        ppPVar5 = std::
                  map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
                  ::operator[]((map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
                                *)&k,(key_type *)&ptr);
        *ppPVar5 = pPVar4;
        finder0._0_4_ = (int)finder0 + 1;
      }
      finder0._4_4_ = finder0._4_4_ + 1;
    }
    std::
    vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
    ::push_back(&this->net,(value_type *)&k);
    std::
    map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
    ::~map((map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
            *)&k);
  }
  return;
}

Assistant:

FC_BPNN::FC_BPNN(int perceptronNum, ...)
{
	va_list ap;
	va_start(ap, 0);
	int num = va_arg(ap, int);
	while (num > -1)
	{
		std::vector<double> layer_value(num, 0.0);
		std::vector<double> layer_loss(num, 0.0);
		layers_value.push_back(layer_value);
		layers_error.push_back(layer_loss);
		num = va_arg(ap, int);
	}
	va_end(ap);

	for (int i = 1; i < layers_value.size(); i++) {
		std::map<size_t, Preceptron*> subNet;
		for (int j = 0; j < layers_value[i - 1].size(); j++) {
			for (int k = 0; k < layers_value[i].size(); k++) {
				size_t finder0 = j;
				size_t finder1 = k;
				size_t finder = (finder0 << 32) | finder1;
				auto ptr = dynamic_cast<Preceptron*>(new Preceptron_SIGMOID());
				ptr->Construct(layers_value[i - 1].size());
				subNet[finder] = ptr;
			}
		}
		net.push_back(subNet);
	}

}